

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O2

void search(int k,DancingNode *header,
           vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions,
           vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
           *Matrix,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *grid)

{
  pointer *pppsVar1;
  int k_00;
  vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *solutions_00;
  s_DancingNode *targetDancingNode;
  DancingNode *pDVar2;
  s_DancingNode *local_48;
  int local_3c;
  vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_> *local_38;
  
  if (header->right == header) {
    printSolutions(solutions,grid);
    return;
  }
  local_38 = solutions;
  targetDancingNode = getMinColumn(header);
  cover(targetDancingNode,Matrix);
  local_3c = k + 1;
  local_48 = targetDancingNode;
  while (solutions_00 = local_38, k_00 = local_3c, local_48 = local_48->down,
        local_48 != targetDancingNode) {
    std::vector<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>::push_back(local_38,&local_48);
    pDVar2 = local_48;
    while (pDVar2 = pDVar2->right, pDVar2 != local_48) {
      cover(pDVar2,Matrix);
    }
    search(k_00,header,solutions_00,Matrix,grid);
    pppsVar1 = &(solutions_00->super__Vector_base<s_DancingNode_*,_std::allocator<s_DancingNode_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppsVar1 = *pppsVar1 + -1;
    targetDancingNode = local_48->column;
    pDVar2 = local_48;
    while (pDVar2 = pDVar2->left, pDVar2 != local_48) {
      uncover(pDVar2,Matrix);
    }
  }
  uncover(targetDancingNode,Matrix);
  return;
}

Assistant:

void search(int k, DancingNode *header, vector<DancingNode*> &solutions, vector<vector<DancingNode>> &Matrix, vector<vector<int>> &grid) 
{ 
    DancingNode *rowNode; 
    DancingNode *rightNode; 
    DancingNode *leftNode; 
    DancingNode *column; 
    //cout<<"IN"<<endl; 
    // if no column left, then we must 
    // have found the solution 
    if(header->right == header) 
    {
        //cout << "OUT" << endl; 
        printSolutions(solutions, grid); 
        return; 
    } 
  
    // choose column deterministically 
    column = getMinColumn(header); 
    //cout << "COVERING" <<endl; 
    // cover chosen column 
    cover(column, Matrix); 
  
    for(rowNode = column->down; rowNode != column;  
        rowNode = rowNode->down ) 
    {
        //cout << "hey u" << endl; 
        solutions.push_back(rowNode); 
  
        for(rightNode = rowNode->right; rightNode != rowNode; 
            rightNode = rightNode->right) 
            cover(rightNode, Matrix); 
  
        // move to level k+1 (recursively) 
        search(k+1, header, solutions, Matrix, grid); 
  
        // if solution in not possible, backtrack (uncover) 
        // and remove the selected row (set) from solution 
        solutions.pop_back(); 
  
        column = rowNode->column; 
        for(leftNode = rowNode->left; leftNode != rowNode; 
            leftNode = leftNode->left) 
            uncover(leftNode, Matrix); 
    } 
  
    uncover(column, Matrix); 
}